

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

string * deqp::gls::FboUtil::getExtensionDescription
                   (string *__return_storage_ptr__,string *extension)

{
  bool bVar1;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d [20];
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *extension_local;
  
  local_18 = extension;
  extension_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"GL_",&local_39);
  bVar1 = de::beginsWith(extension,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_18);
  }
  else {
    bVar1 = std::operator==(local_18,"DEQP_gles3_core_compatible");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"GLES3 compatible context",local_4d);
      std::allocator<char>::~allocator(local_4d);
    }
    else {
      bVar1 = std::operator==(local_18,"DEQP_gles31_core_compatible");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"GLES3.1 compatible context",&local_4e);
        std::allocator<char>::~allocator(&local_4e);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",&local_4f);
        std::allocator<char>::~allocator(&local_4f);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getExtensionDescription (const std::string& extension)
{
	if (de::beginsWith(extension, "GL_"))
		return extension;
	else if (extension == "DEQP_gles3_core_compatible")
		return "GLES3 compatible context";
	else if (extension == "DEQP_gles31_core_compatible")
		return "GLES3.1 compatible context";
	else
	{
		DE_ASSERT(false);
		return "";
	}
}